

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

size_t Memory::LargeHeapBlock::GetAllocPlusSize(uint objectCount)

{
  bool bVar1;
  undefined8 local_18;
  size_t allocPlusSize;
  uint objectCount_local;
  
  local_18 = (ulong)objectCount * 8;
  bVar1 = Recycler::DoProfileAllocTracker();
  if (bVar1) {
    local_18 = (ulong)objectCount * 8 + local_18;
  }
  return local_18;
}

Assistant:

size_t
LargeHeapBlock::GetAllocPlusSize(DECLSPEC_GUARD_OVERFLOW uint objectCount)
{
    // Large Heap Block Layout:
    //      LargeHeapBlock
    //      LargeObjectHeader * [objectCount]
    //      TrackerData *       [objectCount] (Optional)
    size_t allocPlusSize = objectCount * (sizeof(LargeObjectHeader *));
#ifdef PROFILE_RECYCLER_ALLOC
    if (Recycler::DoProfileAllocTracker())
    {
        allocPlusSize += objectCount * sizeof(void *);
    }
#endif
    return allocPlusSize;
}